

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeMemoryFill<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  __index_type *__return_storage_ptr___00;
  Name *mem_00;
  bool bVar1;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  MaybeResult<wasm::Name> _val;
  MaybeResult<wasm::Name> mem;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20);
  maybeMemidx<wasm::WATParser::ParseDefsCtx>
            ((MaybeResult<wasm::Name> *)__return_storage_ptr___00,ctx);
  MaybeResult<wasm::Name>::MaybeResult
            ((MaybeResult<wasm::Name> *)local_78,
             (MaybeResult<wasm::Name> *)__return_storage_ptr___00);
  local_90 = MaybeResult<wasm::Name>::getErr((MaybeResult<wasm::Name> *)local_78);
  bVar1 = local_90 == (Err *)0x0;
  if (!bVar1) {
    wasm::Err::Err(&local_b0,local_90);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  MaybeResult<wasm::Name>::~MaybeResult((MaybeResult<wasm::Name> *)local_78);
  if (bVar1) {
    mem_00 = MaybeResult<wasm::Name>::getPtr
                       ((MaybeResult<wasm::Name> *)
                        ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
    ParseDefsCtx::makeMemoryFill(__return_storage_ptr__,ctx,pos,annotations,mem_00);
  }
  MaybeResult<wasm::Name>::~MaybeResult
            ((MaybeResult<wasm::Name> *)
             ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> makeMemoryFill(Ctx& ctx,
                        Index pos,
                        const std::vector<Annotation>& annotations) {
  auto mem = maybeMemidx(ctx);
  CHECK_ERR(mem);
  return ctx.makeMemoryFill(pos, annotations, mem.getPtr());
}